

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::LossLayer::MergePartialFromCodedStream
          (LossLayer *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  short extraout_AX;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  CategoricalCrossEntropyLossLayer *this_00;
  ulong extraout_RAX;
  MeanSquaredErrorLossLayer *this_01;
  ulong extraout_RAX_00;
  uint tag;
  ulong uVar7;
  int local_44;
  int local_40;
  int local_3c;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_004c0296;
      input->buffer_ = pbVar2 + 1;
      uVar7 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_004c0296:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar7 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar4 | uVar7;
    }
    tag = (uint)uVar7;
    if ((uVar7 & 0x100000000) == 0) goto LAB_004c035f;
    uVar5 = (uint)(uVar7 >> 3) & 0x1fffffff;
    if (uVar5 == 10) {
      if ((char)uVar7 != 'R') goto LAB_004c035f;
      if (this->_oneof_case_[0] != 10) {
        clear_LossLayerType(this);
        this->_oneof_case_[0] = 10;
        this_00 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
        CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer(this_00);
        (this->LossLayerType_).categoricalcrossentropylosslayer_ = this_00;
      }
      MergePartialFromCodedStream();
      iVar6 = local_40;
      uVar7 = extraout_RAX;
joined_r0x004c0351:
      if ((uVar7 & 1) != 0) goto LAB_004c0388;
LAB_004c0386:
      iVar6 = 0;
    }
    else if (uVar5 == 0xb) {
      if ((char)uVar7 == 'Z') {
        if (this->_oneof_case_[0] != 0xb) {
          clear_LossLayerType(this);
          this->_oneof_case_[0] = 0xb;
          this_01 = (MeanSquaredErrorLossLayer *)operator_new(0x28);
          MeanSquaredErrorLossLayer::MeanSquaredErrorLossLayer(this_01);
          (this->LossLayerType_).meansquarederrorlosslayer_ = this_01;
        }
        MergePartialFromCodedStream();
        iVar6 = local_44;
        uVar7 = extraout_RAX_00;
        goto joined_r0x004c0351;
      }
LAB_004c035f:
      iVar6 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,tag);
        if (bVar3) goto LAB_004c0386;
        iVar6 = 6;
      }
    }
    else {
      if ((uVar5 != 1) || (MergePartialFromCodedStream(), extraout_AX == 0)) goto LAB_004c035f;
      iVar6 = local_3c;
      if (extraout_AX == 1) goto LAB_004c0386;
    }
LAB_004c0388:
    if (iVar6 != 0) {
      return iVar6 != 6;
    }
  } while( true );
}

Assistant:

bool LossLayer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LossLayer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.LossLayer.name"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.CategoricalCrossEntropyLossLayer categoricalCrossEntropyLossLayer = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_categoricalcrossentropylosslayer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.MeanSquaredErrorLossLayer meanSquaredErrorLossLayer = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_meansquarederrorlosslayer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LossLayer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LossLayer)
  return false;
#undef DO_
}